

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

bool __thiscall
cmCTestRunTest::EndTest(cmCTestRunTest *this,size_t completed,size_t total,bool started)

{
  int *piVar1;
  _func_int **pp_Var2;
  int iVar3;
  cmCTest *pcVar4;
  cmCTestTestHandler *this_00;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  cmCTestTestProperties *pcVar9;
  size_t sVar10;
  ostream *poVar11;
  long *plVar12;
  cmProcess *pcVar13;
  size_t sVar14;
  long lVar15;
  char cVar16;
  pointer ppVar17;
  char *pcVar18;
  char *pcVar19;
  double dVar20;
  string reason;
  ostringstream cmCTestLog_msg_2;
  char buf [1024];
  string local_5f8;
  char *local_5d8;
  char *local_5d0;
  char local_5c8;
  undefined7 uStack_5c7;
  undefined1 local_5b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8 [6];
  ios_base local_548 [272];
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [6];
  ios_base local_3c8 [920];
  
  bVar6 = this->TestHandler->MemCheck;
  if ((bool)bVar6 == false) {
    bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest);
    if (!bVar5) {
      bVar6 = this->TestHandler->MemCheck;
      goto LAB_003230a9;
    }
LAB_003230ba:
    CompressOutput(this);
  }
  else {
LAB_003230a9:
    if (((bVar6 & 1) != 0) && (bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest), bVar5))
    goto LAB_003230ba;
  }
  WriteLogOutputTop(this,completed,total);
  local_5d8 = &local_5c8;
  local_5d0 = (char *)0x0;
  local_5c8 = '\0';
  iVar8 = 1;
  if (started) {
    iVar8 = cmProcess::GetProcessStatus(this->TestProcess);
  }
  pcVar9 = this->TestProperties;
  iVar3 = this->TestProcess->ExitValue;
  ppVar17 = (pcVar9->RequiredRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar14 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar14 == 0 &&
      ppVar17 !=
      (pcVar9->RequiredRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar18 = "Required regular expression not found.";
    do {
      bVar5 = cmsys::RegularExpression::find(&ppVar17->first,(this->ProcessOutput)._M_dataplus._M_p)
      ;
      if (bVar5) {
        pcVar18 = "Required regular expression found.";
        break;
      }
      ppVar17 = ppVar17 + 1;
    } while (ppVar17 !=
             (this->TestProperties->RequiredRegularExpressions).
             super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::_M_replace((ulong)&local_5d8,0,local_5d0,(ulong)pcVar18);
    std::__cxx11::string::append((char *)&local_5d8);
    ppVar17 = (this->TestProperties->RequiredRegularExpressions).
              super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar17 !=
        (this->TestProperties->RequiredRegularExpressions).
        super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::string::_M_append
                  ((char *)&local_5d8,(ulong)(ppVar17->second)._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_5d8);
        ppVar17 = ppVar17 + 1;
      } while (ppVar17 !=
               (this->TestProperties->RequiredRegularExpressions).
               super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::append((char *)&local_5d8);
    bVar5 = !bVar5;
    pcVar9 = this->TestProperties;
    sVar14 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    bVar5 = false;
  }
  ppVar17 = (pcVar9->ErrorRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ppVar17 !=
       (pcVar9->ErrorRegularExpressions).
       super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (sVar14 == 0)) {
    do {
      bVar7 = cmsys::RegularExpression::find(&ppVar17->first,(this->ProcessOutput)._M_dataplus._M_p)
      ;
      if (bVar7) {
        std::__cxx11::string::_M_replace((ulong)&local_5d8,0,local_5d0,0x633a90);
        std::__cxx11::string::append((char *)&local_5d8);
        std::__cxx11::string::_M_append
                  ((char *)&local_5d8,(ulong)(ppVar17->second)._M_dataplus._M_p);
        bVar5 = true;
        std::__cxx11::string::append((char *)&local_5d8);
        break;
      }
      ppVar17 = ppVar17 + 1;
    } while (ppVar17 !=
             (this->TestProperties->ErrorRegularExpressions).
             super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (iVar8 == 2) {
    cVar16 = this->CTest->OutputTestOutputOnTestFailure;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Exception: ",0xe);
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xef,(char *)local_5b8._0_8_,false);
    pp_Var2 = (_func_int **)(local_5b8 + 0x10);
    if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
      operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    cmProcess::GetExitExceptionString_abi_cxx11_((string *)local_438,this->TestProcess);
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).ExceptionStatus,(string *)local_438);
    if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
      operator_delete((void *)local_438._0_8_,local_428[0]._M_allocated_capacity + 1);
    }
    iVar8 = cmProcess::GetExitException(this->TestProcess);
    switch(iVar8) {
    case 1:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"SegFault",8);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf4,(char *)local_5b8._0_8_,false);
      if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 2;
      break;
    case 2:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Illegal",7);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xf8,(char *)local_5b8._0_8_,false);
      if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 3;
      break;
    case 3:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Interrupt",9);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xfc,(char *)local_5b8._0_8_,false);
      if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 4;
      break;
    case 4:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Numerical",9);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x100,(char *)local_5b8._0_8_,false);
      if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 5;
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_438,(this->TestResult).ExceptionStatus._M_dataplus._M_p,
                 (this->TestResult).ExceptionStatus._M_string_length);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x105,(char *)local_5b8._0_8_,false);
      if ((_func_int **)local_5b8._0_8_ != pp_Var2) {
        operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
      std::ios_base::~ios_base(local_3c8);
      (this->TestResult).Status = 6;
    }
  }
  else if (iVar8 == 5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Timeout ",0xb);
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0xea,(char *)local_5b8._0_8_,false);
    if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
      operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    (this->TestResult).Status = 1;
LAB_00323419:
    cVar16 = this->CTest->OutputTestOutputOnTestFailure;
  }
  else {
    if (iVar8 == 4) {
      if (!bVar5) {
        pcVar9 = this->TestProperties;
        iVar8 = pcVar9->SkipReturnCode;
        if (iVar3 == 0) {
          if (iVar8 != 0) goto LAB_003241ff;
        }
        else if (iVar8 < 0 || iVar8 != iVar3) {
          if ((pcVar9->RequiredRegularExpressions).
              super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (pcVar9->RequiredRegularExpressions).
              super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003232fd;
LAB_003241ff:
          if (pcVar9->WillFail != false) goto LAB_0032420c;
          goto LAB_0032330a;
        }
LAB_003240c2:
        (this->TestResult).Status = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,"SKIP_RETURN_CODE=",0x11);
        std::ostream::operator<<(local_438,this->TestProperties->SkipReturnCode);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).CompletionStatus,(string *)local_5b8);
        if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
          operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"***Skipped ",0xb);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xde,local_5f8._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
        std::ios_base::~ios_base(local_548);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
        std::ios_base::~ios_base(local_3c8);
        bVar6 = 1;
        cVar16 = '\0';
        goto LAB_00323734;
      }
      pcVar9 = this->TestProperties;
      if (pcVar9->SkipReturnCode == iVar3 && -1 < pcVar9->SkipReturnCode) goto LAB_003240c2;
LAB_003232fd:
      if (pcVar9->WillFail != true) {
LAB_0032420c:
        (this->TestResult).Status = 7;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Failed  ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,local_5d8,(long)local_5d0);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0xe6,(char *)local_5b8._0_8_,false);
        if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
          operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
        std::ios_base::~ios_base(local_3c8);
        goto LAB_00323419;
      }
LAB_0032330a:
      (this->TestResult).Status = 9;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"   Passed  ",0xb);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0xe3,(char *)local_5b8._0_8_,false);
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)&(this->TestResult).CompletionStatus);
      if (iVar8 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_438,"***Not Run (Disabled) ",0x16);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x109,(char *)local_5b8._0_8_,false);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"***Not Run ",0xb);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x10c,(char *)local_5b8._0_8_,false);
      }
    }
    if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
      operator_delete((void *)local_5b8._0_8_,local_5a8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    cVar16 = '\0';
  }
  bVar6 = 0;
LAB_00323734:
  iVar8 = (this->TestResult).Status;
  sprintf(local_438,"%6.2f sec",this->TestProcess->TotalTime);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
  sVar10 = strlen(local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,local_438,sVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"\n",1);
  pcVar4 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x112,local_5f8._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
  std::ios_base::~ios_base(local_548);
  if (cVar16 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5b8,(this->ProcessOutput)._M_dataplus._M_p,
                         (this->ProcessOutput)._M_string_length);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x115,local_5f8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
    std::ios_base::~ios_base(local_548);
  }
  poVar11 = this->TestHandler->LogFile;
  if (poVar11 != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Test time = ",0xc);
    sVar10 = strlen(local_438);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_438,sVar10);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  cmWorkingDirectory::cmWorkingDirectory
            ((cmWorkingDirectory *)local_5b8,&this->TestProperties->Directory);
  DartProcessing(this);
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_5b8);
  if ((started) && (this_00 = this->TestHandler, this_00->MemCheck == false)) {
    cmCTestTestHandler::CleanTestOutput
              (this_00,&this->ProcessOutput,
               (long)(&this_00->CustomMaximumPassedTestOutputSize)[(this->TestResult).Status != 9]);
  }
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Reason);
  if (this->TestHandler->LogFile != (ostream *)0x0) {
    iVar3 = (this->TestResult).Status;
    pcVar19 = "Test Pass Reason";
    pcVar18 = "Test Passed.\n";
    if ((iVar3 != 0) && (iVar3 != 9)) {
      pcVar19 = "Test Fail Reason";
      pcVar18 = "Test Failed.\n";
    }
    dVar20 = this->TestProcess->TotalTime;
    sprintf(local_5b8,"%02d:%02d:%02d",(ulong)(uint)(int)(dVar20 / 3600.0),
            (ulong)(uint)((int)(dVar20 / 60.0) % 0x3c),(ulong)(uint)((int)dVar20 % 0x3c));
    poVar11 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"----------------------------------------------------------",0x3a);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    poVar11 = this->TestHandler->LogFile;
    if ((this->TestResult).Reason._M_string_length == 0) {
      lVar15 = 0xd;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar19,0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,":\n",2);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(this->TestResult).Reason._M_dataplus._M_p,
                           (this->TestResult).Reason._M_string_length);
      lVar15 = 1;
      pcVar18 = "\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar18,lVar15);
    poVar11 = this->TestHandler->LogFile;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" end time: ",0xc);
    cmCTest::CurrentTime_abi_cxx11_(&local_5f8,this->CTest);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_5f8._M_dataplus._M_p,local_5f8._M_string_length);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(this->TestProperties->Name)._M_dataplus._M_p,
                         (this->TestProperties->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" time elapsed: ",0x10);
    sVar10 = strlen(local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_5b8,sVar10);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    poVar11 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"----------------------------------------------------------",0x3a);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    plVar12 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
  }
  if (started) {
    bVar5 = false;
    if ((this->TestHandler->MemCheck == false) &&
       (bVar5 = false, this->CompressionRatio <= 1.0 && this->CompressionRatio != 1.0)) {
      bVar5 = cmCTest::ShouldCompressTestOutput(this->CTest);
    }
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).CompressOutput = bVar5;
    pcVar13 = this->TestProcess;
    (this->TestResult).ReturnValue = pcVar13->ExitValue;
    if (bVar6 == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->TestResult).CompletionStatus,0,
                 (char *)(this->TestResult).CompletionStatus._M_string_length,0x6303f2);
      pcVar13 = this->TestProcess;
    }
    (this->TestResult).ExecutionTime = pcVar13->TotalTime;
    MemCheckPostProcess(this);
    if ((this->TestResult).Status == 9) {
      pcVar9 = this->TestProperties;
      dVar20 = (double)pcVar9->PreviousRuns;
      pcVar9->Cost = (float)(((double)pcVar9->Cost * dVar20 + (this->TestResult).ExecutionTime) /
                            (dVar20 + 1.0));
      pcVar9->PreviousRuns = pcVar9->PreviousRuns + 1;
    }
  }
  piVar1 = &this->NumberOfRunsLeft;
  *piVar1 = *piVar1 + -1;
  if (((*piVar1 == 0) || (this->RunUntilFail != true)) || ((this->TestResult).Status != 9)) {
    std::
    vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ::push_back(&this->TestHandler->TestResults,&this->TestResult);
  }
  else {
    this->RunAgain = true;
  }
  pcVar13 = this->TestProcess;
  if (pcVar13 != (cmProcess *)0x0) {
    cmProcess::~cmProcess(pcVar13);
  }
  operator_delete(pcVar13,0xc0);
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8,CONCAT71(uStack_5c7,local_5c8) + 1);
  }
  return (bool)(bVar6 | iVar8 == 9);
}

Assistant:

bool cmCTestRunTest::EndTest(size_t completed, size_t total, bool started)
{
  if ((!this->TestHandler->MemCheck &&
       this->CTest->ShouldCompressTestOutput()) ||
      (this->TestHandler->MemCheck &&
       this->CTest->ShouldCompressTestOutput())) {
    this->CompressOutput();
  }

  this->WriteLogOutputTop(completed, total);
  std::string reason;
  bool passed = true;
  int res =
    started ? this->TestProcess->GetProcessStatus() : cmsysProcess_State_Error;
  int retVal = this->TestProcess->GetExitValue();
  std::vector<std::pair<cmsys::RegularExpression, std::string> >::iterator
    passIt;
  bool forceFail = false;
  bool skipped = false;
  bool outputTestErrorsToConsole = false;
  if (!this->TestProperties->RequiredRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    bool found = false;
    for (passIt = this->TestProperties->RequiredRegularExpressions.begin();
         passIt != this->TestProperties->RequiredRegularExpressions.end();
         ++passIt) {
      if (passIt->first.find(this->ProcessOutput.c_str())) {
        found = true;
        reason = "Required regular expression found.";
        break;
      }
    }
    if (!found) {
      reason = "Required regular expression not found.";
      forceFail = true;
    }
    reason += "Regex=[";
    for (passIt = this->TestProperties->RequiredRegularExpressions.begin();
         passIt != this->TestProperties->RequiredRegularExpressions.end();
         ++passIt) {
      reason += passIt->second;
      reason += "\n";
    }
    reason += "]";
  }
  if (!this->TestProperties->ErrorRegularExpressions.empty() &&
      this->FailedDependencies.empty()) {
    for (passIt = this->TestProperties->ErrorRegularExpressions.begin();
         passIt != this->TestProperties->ErrorRegularExpressions.end();
         ++passIt) {
      if (passIt->first.find(this->ProcessOutput.c_str())) {
        reason = "Error regular expression found in output.";
        reason += " Regex=[";
        reason += passIt->second;
        reason += "]";
        forceFail = true;
        break;
      }
    }
  }
  if (res == cmsysProcess_State_Exited) {
    bool success = !forceFail &&
      (retVal == 0 ||
       !this->TestProperties->RequiredRegularExpressions.empty());
    if (this->TestProperties->SkipReturnCode >= 0 &&
        this->TestProperties->SkipReturnCode == retVal) {
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      std::ostringstream s;
      s << "SKIP_RETURN_CODE=" << this->TestProperties->SkipReturnCode;
      this->TestResult.CompletionStatus = s.str();
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Skipped ");
      skipped = true;
    } else if ((success && !this->TestProperties->WillFail) ||
               (!success && this->TestProperties->WillFail)) {
      this->TestResult.Status = cmCTestTestHandler::COMPLETED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "   Passed  ");
    } else {
      this->TestResult.Status = cmCTestTestHandler::FAILED;
      cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Failed  " << reason);
      outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    }
  } else if (res == cmsysProcess_State_Expired) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Timeout ");
    this->TestResult.Status = cmCTestTestHandler::TIMEOUT;
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
  } else if (res == cmsysProcess_State_Exception) {
    outputTestErrorsToConsole = this->CTest->OutputTestOutputOnTestFailure;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Exception: ");
    this->TestResult.ExceptionStatus =
      this->TestProcess->GetExitExceptionString();
    switch (this->TestProcess->GetExitException()) {
      case cmsysProcess_Exception_Fault:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "SegFault");
        this->TestResult.Status = cmCTestTestHandler::SEGFAULT;
        break;
      case cmsysProcess_Exception_Illegal:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Illegal");
        this->TestResult.Status = cmCTestTestHandler::ILLEGAL;
        break;
      case cmsysProcess_Exception_Interrupt:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Interrupt");
        this->TestResult.Status = cmCTestTestHandler::INTERRUPT;
        break;
      case cmsysProcess_Exception_Numerical:
        cmCTestLog(this->CTest, HANDLER_OUTPUT, "Numerical");
        this->TestResult.Status = cmCTestTestHandler::NUMERICAL;
        break;
      default:
        cmCTestLog(this->CTest, HANDLER_OUTPUT,
                   this->TestResult.ExceptionStatus);
        this->TestResult.Status = cmCTestTestHandler::OTHER_FAULT;
    }
  } else if ("Disabled" == this->TestResult.CompletionStatus) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Not Run (Disabled) ");
  } else // cmsysProcess_State_Error
  {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***Not Run ");
  }

  passed = this->TestResult.Status == cmCTestTestHandler::COMPLETED;
  char buf[1024];
  sprintf(buf, "%6.2f sec", this->TestProcess->GetTotalTime());
  cmCTestLog(this->CTest, HANDLER_OUTPUT, buf << "\n");

  if (outputTestErrorsToConsole) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, this->ProcessOutput << std::endl);
  }

  if (this->TestHandler->LogFile) {
    *this->TestHandler->LogFile << "Test time = " << buf << std::endl;
  }

  // Set the working directory to the tests directory to process Dart files.
  {
    cmWorkingDirectory workdir(this->TestProperties->Directory);
    this->DartProcessing();
  }

  // if this is doing MemCheck then all the output needs to be put into
  // Output since that is what is parsed by cmCTestMemCheckHandler
  if (!this->TestHandler->MemCheck && started) {
    this->TestHandler->CleanTestOutput(
      this->ProcessOutput,
      static_cast<size_t>(
        this->TestResult.Status == cmCTestTestHandler::COMPLETED
          ? this->TestHandler->CustomMaximumPassedTestOutputSize
          : this->TestHandler->CustomMaximumFailedTestOutputSize));
  }
  this->TestResult.Reason = reason;
  if (this->TestHandler->LogFile) {
    bool pass = true;
    const char* reasonType = "Test Pass Reason";
    if (this->TestResult.Status != cmCTestTestHandler::COMPLETED &&
        this->TestResult.Status != cmCTestTestHandler::NOT_RUN) {
      reasonType = "Test Fail Reason";
      pass = false;
    }
    double ttime = this->TestProcess->GetTotalTime();
    int hours = static_cast<int>(ttime / (60 * 60));
    int minutes = static_cast<int>(ttime / 60) % 60;
    int seconds = static_cast<int>(ttime) % 60;
    char buffer[100];
    sprintf(buffer, "%02d:%02d:%02d", hours, minutes, seconds);
    *this->TestHandler->LogFile
      << "----------------------------------------------------------"
      << std::endl;
    if (!this->TestResult.Reason.empty()) {
      *this->TestHandler->LogFile << reasonType << ":\n"
                                  << this->TestResult.Reason << "\n";
    } else {
      if (pass) {
        *this->TestHandler->LogFile << "Test Passed.\n";
      } else {
        *this->TestHandler->LogFile << "Test Failed.\n";
      }
    }
    *this->TestHandler->LogFile
      << "\"" << this->TestProperties->Name
      << "\" end time: " << this->CTest->CurrentTime() << std::endl
      << "\"" << this->TestProperties->Name << "\" time elapsed: " << buffer
      << std::endl
      << "----------------------------------------------------------"
      << std::endl
      << std::endl;
  }
  // if the test actually started and ran
  // record the results in TestResult
  if (started) {
    bool compress = !this->TestHandler->MemCheck &&
      this->CompressionRatio < 1 && this->CTest->ShouldCompressTestOutput();
    this->TestResult.Output =
      compress ? this->CompressedOutput : this->ProcessOutput;
    this->TestResult.CompressOutput = compress;
    this->TestResult.ReturnValue = this->TestProcess->GetExitValue();
    if (!skipped) {
      this->TestResult.CompletionStatus = "Completed";
    }
    this->TestResult.ExecutionTime = this->TestProcess->GetTotalTime();
    this->MemCheckPostProcess();
    this->ComputeWeightedCost();
  }
  // If the test does not need to rerun push the current TestResult onto the
  // TestHandler vector
  if (!this->NeedsToRerun()) {
    this->TestHandler->TestResults.push_back(this->TestResult);
  }
  delete this->TestProcess;
  return passed || skipped;
}